

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O1

double wolfe_eval(vw *all,bfgs *b,float *mem,double loss_sum,double previous_loss_sum,
                 double step_size,double importance_weight_sum,int *origin,double *wolfe1)

{
  double dVar1;
  
  if ((all->weights).sparse == true) {
    dVar1 = wolfe_eval<sparse_parameters>
                      (all,b,mem,loss_sum,previous_loss_sum,step_size,importance_weight_sum,origin,
                       wolfe1,&(all->weights).sparse_weights);
    return dVar1;
  }
  dVar1 = wolfe_eval<dense_parameters>
                    (all,b,mem,loss_sum,previous_loss_sum,step_size,importance_weight_sum,origin,
                     wolfe1,&(all->weights).dense_weights);
  return dVar1;
}

Assistant:

double wolfe_eval(vw& all, bfgs& b, float* mem, double loss_sum, double previous_loss_sum, double step_size,
    double importance_weight_sum, int& origin, double& wolfe1)
{
  if (all.weights.sparse)
    return wolfe_eval(all, b, mem, loss_sum, previous_loss_sum, step_size, importance_weight_sum, origin, wolfe1,
        all.weights.sparse_weights);
  else
    return wolfe_eval(all, b, mem, loss_sum, previous_loss_sum, step_size, importance_weight_sum, origin, wolfe1,
        all.weights.dense_weights);
}